

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

type_t pugi::impl::anon_unknown_0::xpath_sort
                 (xpath_node *begin,xpath_node *end,type_t type,bool rev)

{
  type_t tVar1;
  byte in_CL;
  type_t in_EDX;
  type_t sorted;
  type_t order;
  undefined3 in_stack_00000010;
  xpath_node *in_stack_ffffffffffffffd8;
  type_t in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  
  tVar1 = type_sorted;
  if ((in_CL & 1) != 0) {
    tVar1 = type_sorted_reverse;
  }
  if ((in_EDX == type_unsorted) &&
     (in_stack_ffffffffffffffe0 =
           xpath_get_order((xpath_node *)
                           ((ulong)CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0xffffffff01ffffff),
                           (xpath_node *)CONCAT44(tVar1,in_stack_ffffffffffffffe0)),
     in_EDX = in_stack_ffffffffffffffe0, in_stack_ffffffffffffffe0 == type_unsorted)) {
    (anonymous_namespace)::
    sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (begin,end,(document_order_comparator *)CONCAT44(type,_in_stack_00000010));
    in_EDX = type_sorted;
  }
  if (in_EDX != tVar1) {
    (anonymous_namespace)::reverse<pugi::xpath_node*>
              ((xpath_node *)CONCAT44(tVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  return tVar1;
}

Assistant:

PUGI_IMPL_FN xpath_node_set::type_t xpath_sort(xpath_node* begin, xpath_node* end, xpath_node_set::type_t type, bool rev)
	{
		xpath_node_set::type_t order = rev ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

		if (type == xpath_node_set::type_unsorted)
		{
			xpath_node_set::type_t sorted = xpath_get_order(begin, end);

			if (sorted == xpath_node_set::type_unsorted)
			{
				sort(begin, end, document_order_comparator());

				type = xpath_node_set::type_sorted;
			}
			else
				type = sorted;
		}

		if (type != order) reverse(begin, end);

		return order;
	}